

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slab_cache.c
# Opt level: O1

void slab_cache_check(slab_cache *cache)

{
  byte bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  size_t sVar5;
  ulong uVar6;
  rlist *prVar7;
  byte bVar8;
  rlist *prVar9;
  size_t sVar10;
  rlist *prVar11;
  long lVar12;
  long lVar13;
  byte bVar14;
  bool bVar15;
  size_t sVar16;
  slab_list *psVar17;
  
  prVar11 = (cache->allocated).slabs.next;
  bVar15 = true;
  if ((slab_list *)prVar11 == &cache->allocated) {
    lVar12 = 0;
    sVar10 = 0;
    sVar16 = 0;
  }
  else {
    sVar16 = 0;
    sVar10 = 0;
    lVar12 = 0;
    do {
      if (*(int *)&prVar11[2].next != -0x113f0012) {
        bVar15 = false;
        fprintf(_stderr,"%s: incorrect slab magic, expected %d, got %d","slab_cache_check",
                0xeec0ffee);
      }
      bVar1 = *(byte *)((long)&prVar11[2].next + 4);
      prVar9 = prVar11[2].prev;
      if (cache->order_max + 1 == (uint)bVar1) {
        lVar12 = (long)&prVar9->prev + lVar12;
        sVar10 = (long)&prVar9->prev + sVar10;
      }
      else {
        if (cache->order_max < bVar1) goto LAB_00105aef;
        uVar2 = cache->order0_size_lb;
        prVar7 = (rlist *)(1L << (bVar1 + uVar2 & 0x3f));
        if (prVar9 != prVar7) {
          bVar15 = false;
          fprintf(_stderr,"%s: incorrect slab size, expected %zu, got %zu","slab_cache_check",prVar7
                 );
        }
        uVar3 = cache->order0_size_lb;
        prVar9 = (rlist *)(1L << (cache->order_max + uVar3 & 0x3f));
      }
      sVar16 = (long)&prVar9->prev + sVar16;
      prVar11 = prVar11->next;
    } while ((slab_list *)prVar11 != &cache->allocated);
  }
  sVar5 = (cache->allocated).stats.total;
  if (sVar16 != sVar5) {
    bVar15 = false;
    fprintf(_stderr,"%s: incorrect slab statistics, total %zu, factual %zu\n","slab_cache_check",
            sVar5,sVar16);
  }
  bVar1 = cache->order_max;
  bVar14 = 0;
  lVar13 = 0;
  psVar17 = cache->orders;
  while (bVar14 <= bVar1) {
    bVar8 = (byte)(1L << (bVar14 + cache->order0_size_lb & 0x3f));
    if (bVar1 < bVar8) break;
    uVar6 = (psVar17->stats).total;
    sVar10 = sVar10 + (psVar17->stats).used;
    if (((1L << (cache->order0_size_lb + bVar8 & 0x3f)) - 1U & uVar6) != 0) {
      bVar15 = false;
      fprintf(_stderr,
              "%s: incorrect order statistics, the total %zu is not multiple of slab size %zu\n",
              "slab_cache_check",uVar6);
    }
    if (cache->order_max < bVar8) break;
    uVar4 = cache->order0_size_lb;
    if (((1L << (bVar8 + uVar4 & 0x3f)) - 1U & (psVar17->stats).used) != 0) {
      bVar15 = false;
      fprintf(_stderr,
              "%s: incorrect order statistics, the used %zu is not multiple of slab size %zu\n",
              "slab_cache_check");
    }
    lVar13 = lVar13 + uVar6;
    psVar17 = psVar17 + 1;
    bVar1 = cache->order_max;
    bVar14 = bVar14 + 1;
    if (cache->orders + bVar1 < psVar17) {
      if (lVar12 + lVar13 != sVar16) {
        bVar15 = false;
        fprintf(_stderr,"%s: incorrect totals, ordered %zu,  huge %zu, total %zu\n",
                "slab_cache_check",lVar13);
      }
      sVar16 = (cache->allocated).stats.used;
      if (sVar10 != sVar16) {
        bVar15 = false;
        fprintf(_stderr,"%s: incorrect used total, total %zu, sum %zu\n","slab_cache_check",sVar16,
                sVar10);
      }
      if (!bVar15) {
        abort();
      }
      return;
    }
  }
LAB_00105aef:
  __assert_fail("order <= cache->order_max",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/slab_cache.h"
                ,0xee,"intptr_t slab_order_size(struct slab_cache *, uint8_t)");
}

Assistant:

void
slab_cache_check(struct slab_cache *cache)
{
	size_t total = 0;
	size_t used = 0;
	size_t ordered = 0;
	size_t huge = 0;
	bool dont_panic = true;

	struct rlist *slabs = &cache->allocated.slabs;
	struct slab *slab;

	rlist_foreach_entry(slab, slabs, next_in_cache) {
		if (slab->magic != slab_magic) {
			fprintf(stderr, "%s: incorrect slab magic,"
				" expected %d, got %d", __func__,
				slab_magic, slab->magic);
			dont_panic = false;
		}
		if (slab->order == cache->order_max + 1) {
			huge += slab->size;
			used += slab->size;
			total += slab->size;
		} else {
			if ((intptr_t) slab->size !=
					slab_order_size(cache, slab->order)) {
				fprintf(stderr, "%s: incorrect slab size,"
					" expected %zu, got %zu", __func__,
					slab_order_size(cache, slab->order),
					slab->size);
				dont_panic = false;
			}
			/*
			 * The slab may have been reformatted
			 * and split into smaller slabs, don't
			 * trust slab->size.
			 */
			total += slab_order_size(cache, cache->order_max);
		}
	}

	if (total != cache->allocated.stats.total) {
		fprintf(stderr, "%s: incorrect slab statistics, total %zu,"
			" factual %zu\n", __func__,
			cache->allocated.stats.total,
			total);
		dont_panic = false;
	}
	struct slab_list *list;
	for (list = cache->orders;
	     list <= cache->orders + cache->order_max;
	     list++) {

		uint8_t order = slab_order_size(cache, list - cache->orders);
		ordered += list->stats.total;
		used += list->stats.used;

		if (list->stats.total % slab_order_size(cache, order)) {
			fprintf(stderr, "%s: incorrect order statistics, the"
				" total %zu is not multiple of slab size %zu\n",
				__func__, list->stats.total,
				slab_order_size(cache, order));
			dont_panic = false;
		}
		if (list->stats.used % slab_order_size(cache, order)) {
			fprintf(stderr, "%s: incorrect order statistics, the"
				" used %zu is not multiple of slab size %zu\n",
				__func__, list->stats.used,
				slab_order_size(cache, order));
			dont_panic = false;
		}
	}

	if (ordered + huge != total) {
		fprintf(stderr, "%s: incorrect totals, ordered %zu, "
			" huge %zu, total %zu\n", __func__,
			ordered, huge, total);
		dont_panic = false;
	}
	if (used != cache->allocated.stats.used) {
		fprintf(stderr, "%s: incorrect used total, "
			"total %zu, sum %zu\n", __func__,
			cache->allocated.stats.used,
			used);
		dont_panic = false;
	}
	if (dont_panic)
		return;
	abort();
}